

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O3

float __thiscall lda::digamma(lda *this,float x)

{
  lda_math_mode lVar1;
  double dVar2;
  float fVar3;
  ostream *poVar4;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
  local_19;
  undefined1 local_18 [16];
  
  lVar1 = this->mmode;
  if (lVar1 != USE_SIMD) {
    if (lVar1 == USE_PRECISE) {
      dVar2 = boost::math::detail::
              digamma_imp<double,boost::integral_constant<int,24>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                        ((double)x,(integral_constant<int,_24> *)0x0,&local_19);
      local_18._0_4_ = SUB84(dVar2,0);
      local_18._4_4_ = (undefined4)((ulong)dVar2 >> 0x20);
      if (3.4028234663852886e+38 < ABS(dVar2)) {
        local_18._8_4_ = extraout_XMM0_Dc;
        local_18._0_8_ = dVar2;
        local_18._12_4_ = extraout_XMM0_Dd;
        boost::math::policies::detail::raise_error<std::overflow_error,float>
                  ("boost::math::digamma<%1%>(%1%)","numeric overflow");
      }
      return (float)(double)CONCAT44(local_18._4_4_,local_18._0_4_);
    }
    if (lVar1 != USE_FAST_APPROX) {
      poVar4 = std::operator<<((ostream *)&std::cerr,
                               "lda::digamma: Trampled or invalid math mode, aborting");
      std::endl<char,std::char_traits<char>>(poVar4);
      abort();
    }
  }
  fVar5 = x + 2.0;
  fVar3 = (float)((uint)fVar5 & 0x7fffff | 0x3f000000);
  auVar6._4_12_ = DAT_002835a0._4_12_;
  auVar6._0_4_ = x * 6.0 + 13.0;
  auVar7._4_4_ = fVar3 + 0.35208872;
  auVar7._0_4_ = fVar5 * 12.0 * fVar5;
  auVar7._8_8_ = 0;
  auVar7 = divps(auVar6,auVar7);
  return ((fVar3 * -1.4980303 + (float)(uint)fVar5 * 1.1920929e-07 + -124.22545) - auVar7._4_4_) *
         0.6931472 + (-(x + x + 1.0) / ((x + 1.0) * x) - auVar7._0_4_);
}

Assistant:

float lda::digamma(float x)
{
  switch (mmode)
  {
    case USE_FAST_APPROX:
      // std::cerr << "lda::digamma FAST_APPROX ";
      return ldamath::digamma<float, USE_FAST_APPROX>(x);
    case USE_PRECISE:
      // std::cerr << "lda::digamma PRECISE ";
      return ldamath::digamma<float, USE_PRECISE>(x);
    case USE_SIMD:
      // std::cerr << "lda::digamma SIMD ";
      return ldamath::digamma<float, USE_SIMD>(x);
    default:
      // Should not happen.
      std::cerr << "lda::digamma: Trampled or invalid math mode, aborting" << std::endl;
      abort();
      return 0.0f;
  }
}